

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrUtils-CPConv_IConv.c
# Opt level: O2

UINT8 CPConv_StrConvert(CPCONV *cpc,size_t *outSize,char **outStr,size_t inSize,char *inStr)

{
  int iVar1;
  size_t *psVar2;
  UINT8 UVar3;
  size_t sVar4;
  int *piVar5;
  size_t sVar6;
  long lVar7;
  size_t __size;
  char *outPtr;
  size_t remBytesIn;
  char *inPtr;
  size_t remBytesOut;
  char *local_58;
  size_t local_50;
  size_t *local_48;
  char *local_40;
  size_t local_38;
  
  iconv(cpc->hIConv,(char **)0x0,(size_t *)0x0,(char **)0x0,(size_t *)0x0);
  local_50 = inSize;
  local_48 = outSize;
  if ((inSize == 0) && (local_50 = strlen(inStr), local_50 == 0)) {
    UVar3 = '\x02';
    sVar6 = 0;
  }
  else {
    local_58 = *outStr;
    local_40 = inStr;
    if (local_58 == (char *)0x0) {
      __size = local_50 * 3 >> 1;
      local_58 = (char *)malloc(__size);
      *outStr = local_58;
    }
    else {
      __size = *outSize;
    }
    local_38 = __size;
    while (sVar4 = iconv(cpc->hIConv,&local_40,&local_50,&local_58,&local_38),
          sVar4 == 0xffffffffffffffff) {
      piVar5 = __errno_location();
      psVar2 = local_48;
      iVar1 = *piVar5;
      if ((iVar1 == 0x54) || (iVar1 == 0x16)) {
        UVar3 = 0x80;
        local_48 = psVar2;
        if ((iVar1 == 0x16) && (local_50 < 2)) {
          iconv(cpc->hIConv,(char **)0x0,(size_t *)0x0,&local_58,&local_38);
          UVar3 = '\x01';
          local_48 = psVar2;
        }
        goto LAB_00163b63;
      }
      lVar7 = (long)local_58 - (long)*outStr;
      __size = __size + local_50 * 2;
      local_58 = (char *)realloc(*outStr,__size);
      *outStr = local_58;
      local_58 = local_58 + lVar7;
      local_38 = __size - lVar7;
    }
    UVar3 = '\0';
LAB_00163b63:
    sVar6 = (long)local_58 - (long)*outStr;
  }
  *local_48 = sVar6;
  return UVar3;
}

Assistant:

UINT8 CPConv_StrConvert(CPCONV* cpc, size_t* outSize, char** outStr, size_t inSize, const char* inStr)
{
	size_t outBufSize;
	size_t remBytesIn;
	size_t remBytesOut;
	char* inPtr;
	char* outPtr;
	size_t wrtBytes;
	char resVal;
	
	iconv(cpc->hIConv, NULL, NULL, NULL, NULL);	// reset conversion state
	
	remBytesIn = inSize ? inSize : strlen(inStr);
	inPtr = (char*)&inStr[0];	// const-cast due to a bug in the API
	if (remBytesIn == 0)
	{
		*outSize = 0;
		return 0x02;	// nothing to convert
	}
	
	if (*outStr == NULL)
	{
		outBufSize = remBytesIn * 3 / 2;
		*outStr = (char*)malloc(outBufSize);
	}
	else
	{
		outBufSize = *outSize;
	}
	remBytesOut = outBufSize;
	outPtr = *outStr;
	
	resVal = 0x00;
	wrtBytes = iconv(cpc->hIConv, &inPtr, &remBytesIn, &outPtr, &remBytesOut);
	while(wrtBytes == (size_t)-1)
	{
		if (errno == EILSEQ || errno == EINVAL)
		{
			// invalid encoding
			resVal = 0x80;
			if (errno == EINVAL && remBytesIn <= 1)
			{
				// assume that the string got truncated
				iconv(cpc->hIConv, NULL, NULL, &outPtr, &remBytesOut);
				resVal = 0x01;
			}
			break;
		}
		// errno == E2BIG
		wrtBytes = outPtr - *outStr;
		outBufSize += remBytesIn * 2;
		*outStr = (char*)realloc(*outStr, outBufSize);
		outPtr = *outStr + wrtBytes;
		remBytesOut = outBufSize - wrtBytes;
		
		wrtBytes = iconv(cpc->hIConv, &inPtr, &remBytesIn, &outPtr, &remBytesOut);
	}
	
	*outSize = outPtr - *outStr;
	return resVal;
}